

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce.h
# Opt level: O0

void __thiscall
AllReduceSockets::AllReduceSockets
          (AllReduceSockets *this,string *pspan_server,size_t punique_id,size_t ptotal,size_t pnode)

{
  size_t in_RCX;
  size_t in_RDX;
  string *in_RSI;
  AllReduce *in_RDI;
  size_t in_R8;
  
  AllReduce::AllReduce(in_RDI,in_RCX,in_R8);
  in_RDI->_vptr_AllReduce = (_func_int **)&PTR__AllReduceSockets_00474350;
  node_socks::node_socks((node_socks *)(in_RDI + 1));
  std::__cxx11::string::string((string *)(in_RDI + 3),in_RSI);
  in_RDI[4].total = in_RDX;
  return;
}

Assistant:

AllReduceSockets(std::string pspan_server, const size_t punique_id, size_t ptotal, const size_t pnode)
      : AllReduce(ptotal, pnode), span_server(pspan_server), unique_id(punique_id)
  {
  }